

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O2

void test_qclab_dense_kron<std::complex<float>>(void)

{
  complex<float> m32;
  complex<float> m32_00;
  complex<float> in_RCX;
  complex<float> cVar1;
  complex<float> in_RDX;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> m01_01;
  complex<float> in_RSI;
  complex<float> cVar2;
  complex<float> in_R8;
  _Alloc_hider m11;
  char *pcVar3;
  complex<float> in_stack_fffffffffffffde8;
  SquareMatrix<std::complex<float>_> A;
  SquareMatrix<std::complex<float>_> B;
  AssertHelper local_1f0;
  Message local_1e8;
  SquareMatrix<std::complex<float>_> BoA_check;
  SquareMatrix<std::complex<float>_> AoB;
  SquareMatrix<std::complex<float>_> XoI_check;
  string local_1b0;
  AssertionResult gtest_ar__3;
  SquareMatrix<std::complex<float>_> BoA;
  SquareMatrix<std::complex<float>_> XoI;
  SquareMatrix<std::complex<float>_> X;
  SquareMatrix<std::complex<float>_> I;
  SquareMatrix<std::complex<float>_> AoB_check;
  SquareMatrix<std::complex<float>_> IoX_check;
  SquareMatrix<std::complex<float>_> IoX;
  
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&I,in_RSI,in_RDX,in_RCX,in_R8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&X,in_RSI,m01,in_RCX,in_R8);
  qclab::dense::kron<std::complex<float>>((dense *)&IoX,&I,&X);
  pcVar3 = (char *)0x0;
  cVar2._M_value._1_7_ = A.size_._1_7_;
  cVar2._M_value._0_1_ = (undefined1)A.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&IoX_check,(complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x3f800000,
             (complex<float>)0x3f800000,(complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x0,
             (complex<float>)0x0,(complex<float>)0x3f800000,(complex<float>)0x0,(complex<float>)0x0,
             (complex<float>)0x3f800000,(complex<float>)0x0,in_stack_fffffffffffffde8,cVar2,
             (complex<float>)
             A.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  XoI.size_._0_1_ = qclab::dense::SquareMatrix<std::complex<float>_>::operator==(&IoX,&IoX_check);
  XoI.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0;
  if (!(bool)(undefined1)XoI.size_) {
    testing::Message::Message((Message *)&XoI_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)&XoI,(AssertionResult *)"IoX == IoX_check","false","true",
               pcVar3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&A,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,local_1b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&A,(Message *)&XoI_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&A);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (XoI_check.size_ != 0) {
      (**(code **)(*(long *)XoI_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&XoI.data_);
  qclab::dense::kron<std::complex<float>>((dense *)&XoI,&X,&I);
  cVar1._M_value = 0;
  m11._M_p = (char *)0x0;
  pcVar3 = (char *)0x0;
  m32._M_value._1_7_ = A.size_._1_7_;
  m32._M_value._0_1_ = (undefined1)A.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&XoI_check,(complex<float>)0x0,(complex<float>)0x3f800000,(complex<float>)0x0,
             (complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x3f800000,(complex<float>)0x0,
             (complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x3f800000,
             (complex<float>)0x0,(complex<float>)0x0,in_stack_fffffffffffffde8,m32,
             (complex<float>)
             A.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  cVar2._M_value = (_ComplexT)&XoI_check;
  A.size_._0_1_ =
       qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                 (&XoI,(SquareMatrix<std::complex<float>_> *)cVar2._M_value);
  A.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0;
  if (!(bool)(undefined1)A.size_) {
    testing::Message::Message((Message *)&B);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)&A,(AssertionResult *)"XoI == XoI_check","false","true",pcVar3
              );
    cVar1._M_value = 0x1c;
    m11._M_p = local_1b0._M_dataplus._M_p;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&AoB,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,local_1b0._M_dataplus._M_p);
    cVar2._M_value = (_ComplexT)&B;
    testing::internal::AssertHelper::operator=((AssertHelper *)&AoB,(Message *)cVar2._M_value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&AoB);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (B.size_ != 0) {
      (**(code **)(*(long *)B.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&A.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&A,cVar2,m01_00,cVar1,(complex<float>)m11._M_p);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&B,cVar2,m01_01,cVar1,(complex<float>)m11._M_p);
  qclab::dense::kron<std::complex<float>>((dense *)&AoB,&A,&B);
  pcVar3 = (char *)0x424c0000;
  cVar1._M_value._1_7_ = A.size_._1_7_;
  cVar1._M_value._0_1_ = (undefined1)A.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&AoB_check,(complex<float>)0x42aa0000,(complex<float>)0x420c0000,
             (complex<float>)0x42040000,(complex<float>)0x42820000,(complex<float>)0x424c0000,
             (complex<float>)0x41a80000,(complex<float>)0x42040000,(complex<float>)0x420c0000,
             (complex<float>)0x425c0000,(complex<float>)0x421c0000,(complex<float>)0x424c0000,
             (complex<float>)0x42820000,(complex<float>)0x42aa0000,in_stack_fffffffffffffde8,cVar1,
             (complex<float>)
             A.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  BoA.size_._0_1_ = qclab::dense::SquareMatrix<std::complex<float>_>::operator==(&AoB,&AoB_check);
  BoA.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0;
  if (!(bool)(undefined1)BoA.size_) {
    testing::Message::Message((Message *)&BoA_check);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)&BoA,(AssertionResult *)"AoB == AoB_check","false","true",
               pcVar3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,local_1b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&BoA_check);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (BoA_check.size_ != 0) {
      (**(code **)(*(long *)BoA_check.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&BoA.data_);
  qclab::dense::kron<std::complex<float>>((dense *)&BoA,&B,&A);
  pcVar3 = (char *)0x42820000;
  m32_00._M_value._1_7_ = A.size_._1_7_;
  m32_00._M_value._0_1_ = (undefined1)A.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&BoA_check,(complex<float>)0x42aa0000,(complex<float>)0x41880000,
             (complex<float>)0x41d00000,(complex<float>)0x424c0000,(complex<float>)0x42820000,
             (complex<float>)0x41500000,(complex<float>)0x41d00000,(complex<float>)0x41880000,
             (complex<float>)0x42080000,(complex<float>)0x421c0000,(complex<float>)0x42820000,
             (complex<float>)0x424c0000,(complex<float>)0x42aa0000,in_stack_fffffffffffffde8,m32_00,
             (complex<float>)
             A.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  gtest_ar__3.success_ =
       qclab::dense::SquareMatrix<std::complex<float>_>::operator==(&BoA,&BoA_check);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)&gtest_ar__3,(AssertionResult *)"BoA == BoA_check","false",
               "true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,local_1b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (local_1e8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_1e8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&BoA_check.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&BoA.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&AoB_check.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&AoB.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&B.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&A.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&XoI_check.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&XoI.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&IoX_check.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&IoX.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&X.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&I.data_);
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}